

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O1

RGBSigmoidPolynomial __thiscall pbrt::RGBColorSpace::ToRGBCoeffs(RGBColorSpace *this,RGB *rgb)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  RGBSigmoidPolynomial RVar4;
  RGB local_10;
  
  uVar1._0_4_ = rgb->r;
  uVar1._4_4_ = rgb->g;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar1;
  if ((0.0 <= (float)(undefined4)uVar1) && (auVar2 = vmovshdup_avx(auVar3), 0.0 <= auVar2._0_4_)) {
    if (0.0 <= rgb->b) {
      auVar3 = vmaxps_avx(auVar3,ZEXT816(0) << 0x40);
      auVar2 = vmaxss_avx(ZEXT416((uint)rgb->b),ZEXT816(0) << 0x20);
      local_10._0_8_ = vmovlps_avx(auVar3);
      local_10.b = auVar2._0_4_;
      RVar4 = RGBToSpectrumTable::operator()(this->rgbToSpectrumTable,&local_10);
      return RVar4;
    }
  }
  LogFatal<char_const(&)[39]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/colorspace.cpp"
             ,0x2c,"Check failed: %s",(char (*) [39])"rgb.r >= 0 && rgb.g >= 0 && rgb.b >= 0");
}

Assistant:

RGBSigmoidPolynomial RGBColorSpace::ToRGBCoeffs(const RGB &rgb) const {
    CHECK(rgb.r >= 0 && rgb.g >= 0 && rgb.b >= 0);
    return (*rgbToSpectrumTable)(ClampZero(rgb));
}